

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::BitfieldExtractCase::BitfieldExtractCase
          (BitfieldExtractCase *this,Context *context,DataType baseType,Precision precision,
          ShaderType shaderType)

{
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  allocator<char> local_a1;
  VarType local_a0;
  string local_88;
  Symbol local_68;
  
  getIntegerFuncCaseName_abi_cxx11_
            (&local_68.name,(Functional *)(ulong)baseType,precision,shaderType,shaderType);
  IntegerFunctionCase::IntegerFunctionCase
            (&this->super_IntegerFunctionCase,context,local_68.name._M_dataplus._M_p,
             "bitfieldExtract",shaderType);
  std::__cxx11::string::~string((string *)&local_68);
  (this->super_IntegerFunctionCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IntegerFunctionCase_01e54db0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"value",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_88,&local_a0);
  this_00 = &(this->super_IntegerFunctionCase).m_spec.inputs;
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>(this_00,&local_68);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"offset",&local_a1);
  glu::VarType::VarType(&local_a0,TYPE_INT,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>(this_00,&local_68);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"bits",&local_a1);
  glu::VarType::VarType(&local_a0,TYPE_INT,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>(this_00,&local_68);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"extracted",&local_a1);
  glu::VarType::VarType(&local_a0,baseType,precision);
  deqp::gls::ShaderExecUtil::Symbol::Symbol(&local_68,&local_88,&local_a0);
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::emplace_back<deqp::gls::ShaderExecUtil::Symbol>
            (&(this->super_IntegerFunctionCase).m_spec.outputs,&local_68);
  deqp::gls::ShaderExecUtil::Symbol::~Symbol(&local_68);
  glu::VarType::~VarType(&local_a0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::assign((char *)&(this->super_IntegerFunctionCase).m_spec.source);
  return;
}

Assistant:

BitfieldExtractCase (Context& context, glu::DataType baseType, glu::Precision precision, glu::ShaderType shaderType)
		: IntegerFunctionCase(context, getIntegerFuncCaseName(baseType, precision, shaderType).c_str(), "bitfieldExtract", shaderType)
	{
		m_spec.inputs.push_back(Symbol("value", glu::VarType(baseType, precision)));
		m_spec.inputs.push_back(Symbol("offset", glu::VarType(glu::TYPE_INT, precision)));
		m_spec.inputs.push_back(Symbol("bits", glu::VarType(glu::TYPE_INT, precision)));
		m_spec.outputs.push_back(Symbol("extracted", glu::VarType(baseType, precision)));
		m_spec.source = "extracted = bitfieldExtract(value, offset, bits);";
	}